

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cpp
# Opt level: O2

void ncnn::cubic_coeffs(int w,int outw,int *xofs,float *alpha)

{
  int iVar1;
  float *pfVar2;
  ulong uVar3;
  float *pfVar4;
  ulong uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  uVar3 = 0;
  uVar5 = (ulong)(uint)outw;
  if (outw < 1) {
    uVar5 = uVar3;
  }
  pfVar4 = alpha + 3;
  do {
    if (uVar5 == uVar3) {
      return;
    }
    fVar8 = ((float)(int)uVar3 + 0.5) * (float)w * (1.0 / (float)outw) + -0.5;
    fVar6 = floorf(fVar8);
    iVar1 = (int)fVar6;
    fVar8 = fVar8 - (float)(int)fVar6;
    fVar6 = fVar8 + 1.0;
    fVar7 = 1.0 - fVar8;
    fVar6 = (3.75 - fVar6 * 0.75) * fVar6 * fVar6 + fVar6 * -6.0 + 3.0;
    fVar8 = (fVar8 * 1.25 + -2.25) * fVar8 * fVar8 + 1.0;
    *(ulong *)(pfVar4 + -3) = CONCAT44(fVar8,fVar6);
    fVar7 = (fVar7 * 1.25 + -2.25) * fVar7 * fVar7;
    pfVar4[-1] = fVar7 + 1.0;
    *pfVar4 = -(fVar7 + fVar6 + fVar8);
    if (iVar1 < 0) {
      pfVar2 = alpha + uVar3 * 4 + 3;
      fVar6 = 1.0 - *pfVar4;
      pfVar4[-3] = fVar6;
      pfVar4[-2] = *pfVar4;
      pfVar4[-1] = 0.0;
LAB_00153e23:
      *pfVar2 = 0.0;
      iVar1 = 1;
    }
    else if (iVar1 == 0) {
      fVar6 = fVar6 + pfVar4[-2];
      pfVar4[-3] = fVar6;
      *(undefined8 *)(pfVar4 + -2) = *(undefined8 *)(pfVar4 + -1);
      pfVar2 = pfVar4;
      goto LAB_00153e23;
    }
    if (iVar1 == w + -2) {
      *pfVar4 = *pfVar4 + pfVar4[-1];
      pfVar4[-1] = pfVar4[-2];
      pfVar4[-2] = fVar6;
LAB_00153e71:
      pfVar4[-3] = 0.0;
      iVar1 = w + -3;
    }
    else if (w + -1 <= iVar1) {
      *pfVar4 = 1.0 - fVar6;
      pfVar4[-1] = fVar6;
      pfVar4[-2] = 0.0;
      goto LAB_00153e71;
    }
    xofs[uVar3] = iVar1;
    uVar3 = uVar3 + 1;
    pfVar4 = pfVar4 + 4;
  } while( true );
}

Assistant:

static void cubic_coeffs(int w, int outw, int* xofs, float* alpha)
{
    double scale = (double)w / outw;

    for (int dx = 0; dx < outw; dx++)
    {
        float fx = (float)((dx + 0.5) * scale - 0.5);
        int sx = floor(fx);
        fx -= sx;

        interpolate_cubic(fx, alpha + dx*4);

        if (sx <= -1)
        {
            sx = 1;
            alpha[dx*4 +0] = 1.f - alpha[dx*4 +3];
            alpha[dx*4 +1] = alpha[dx*4 +3];
            alpha[dx*4 +2] = 0.f;
            alpha[dx*4 +3] = 0.f;
        }
        if (sx == 0)
        {
            sx = 1;
            alpha[dx*4 +0] = alpha[dx*4 +0] + alpha[dx*4 +1];
            alpha[dx*4 +1] = alpha[dx*4 +2];
            alpha[dx*4 +2] = alpha[dx*4 +3];
            alpha[dx*4 +3] = 0.f;
        }
        if (sx == w - 2)
        {
            sx = w - 3;
            alpha[dx*4 +3] = alpha[dx*4 +2] + alpha[dx*4 +3];
            alpha[dx*4 +2] = alpha[dx*4 +1];
            alpha[dx*4 +1] = alpha[dx*4 +0];
            alpha[dx*4 +0] = 0.f;
        }
        if (sx >= w - 1)
        {
            sx = w - 3;
            alpha[dx*4 +3] = 1.f - alpha[dx*4 +0];
            alpha[dx*4 +2] = alpha[dx*4 +0];
            alpha[dx*4 +1] = 0.f;
            alpha[dx*4 +0] = 0.f;
        }

        xofs[dx] = sx;
    }
}